

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

string * __thiscall units::repr_abi_cxx11_(string *__return_storage_ptr__,units *this,char *str)

{
  string local_40;
  allocator local_19;
  
  std::__cxx11::string::string((string *)&local_40,(char *)this,&local_19);
  repr(__return_storage_ptr__,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string repr(char* str) {
    return repr(string(str));
}